

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall glcts::anon_unknown_0::Logger::~Logger(Logger *this)

{
  TestLog *this_00;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  this_00 = glcts::(anonymous_namespace)::Logger::s_tcuLog;
  std::__cxx11::stringbuf::str();
  tcu::TestLog::writeMessage(this_00,(char *)local_38);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  if (local_30 != 0) {
    tcu::TestLog::writeMessage(glcts::(anonymous_namespace)::Logger::s_tcuLog,"\n");
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->str_);
  std::ios_base::~ios_base
            ((ios_base *)&(this->str_).super_basic_ostream<char,_std::char_traits<char>_>.field_0x70
            );
  return;
}

Assistant:

~Logger()
	{
		s_tcuLog->writeMessage(str_.str().c_str());
		if (!str_.str().empty())
		{
			s_tcuLog->writeMessage(NL);
		}
	}